

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration_object.c
# Opt level: O0

char * configuration_object_read(char *path)

{
  FILE *__stream;
  size_t __n;
  size_t sVar1;
  char *in_RDI;
  char *buffer;
  size_t size_read;
  size_t size;
  FILE *file;
  char *local_8;
  
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    local_8 = (char *)malloc(__n + 1);
    if (local_8 == (char *)0x0) {
      log_write_impl_va("metacall",0x5d,"configuration_object_read",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                        ,LOG_LEVEL_ERROR,"Invalid configuration file stream allocation");
      fclose(__stream);
      local_8 = (char *)0x0;
    }
    else {
      sVar1 = fread(local_8,1,__n,__stream);
      fclose(__stream);
      if (sVar1 == __n) {
        local_8[sVar1] = '\0';
      }
      else {
        log_write_impl_va("metacall",0x6a,"configuration_object_read",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration_object.c"
                          ,LOG_LEVEL_ERROR,"Invalid configuration file size read (%u != %u)",sVar1,
                          __n);
        free(local_8);
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

char *configuration_object_read(const char *path)
{
	FILE *file = fopen(path, "rb");

	size_t size, size_read;

	char *buffer;

	if (file == NULL)
	{
		return NULL;
	}

	fseek(file, 0, SEEK_END);

	size = ftell(file);

	fseek(file, 0, SEEK_SET);

	buffer = malloc(sizeof(char) * (size + 1));

	if (buffer == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration file stream allocation");

		fclose(file);

		return NULL;
	}

	size_read = fread(buffer, sizeof(char), size, file);

	fclose(file);

	if (size_read != size)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration file size read (%u != %u)", size_read, size);

		free(buffer);

		return NULL;
	}

	buffer[size_read] = '\0';

	return buffer;
}